

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

String * __thiscall
indigox::utils::randomString_abi_cxx11_(String *__return_storage_ptr__,utils *this,size_t length)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  utils *puVar5;
  random_device rStack_13b8;
  
  if (randomString[abi:cxx11](unsigned_long)::rg == '\0') {
    iVar1 = __cxa_guard_acquire(&randomString[abi:cxx11](unsigned_long)::rg);
    if (iVar1 != 0) {
      std::random_device::random_device(&rStack_13b8);
      uVar2 = std::random_device::_M_getval();
      uVar3 = (ulong)uVar2;
      lVar4 = 1;
      randomString::rg._M_x[0] = uVar3;
      do {
        uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
        randomString::rg._M_x[lVar4] = uVar3;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x270);
      randomString::rg._M_p = 0x270;
      std::random_device::_M_fini();
      __cxa_guard_release(&randomString[abi:cxx11](unsigned_long)::rg);
    }
  }
  if (randomString[abi:cxx11](unsigned_long)::pick == '\0') {
    randomString_abi_cxx11_();
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  puVar5 = this + 1;
  while (puVar5 = puVar5 + -1, puVar5 != (utils *)0x0) {
    std::uniform_int_distribution<unsigned_long>::operator()
              (&randomString::pick,&randomString::rg,&randomString::pick._M_param);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

String randomString(size_t length) {
      static auto& chrs = "qwertyuiopasdfghjklzxcvbnmZAQXSWCDEVFRBGTNHYMJUKILOP";
      
      static std::mt19937 rg{std::random_device{}()};
      static std::uniform_int_distribution<size_t> pick(0, sizeof(chrs) - 2);
      
      String s;
      s.reserve(length + 4);  // no need to copy when adding extensions
      
      while(length--)
        s += chrs[pick(rg)];
      return s;
      
    }